

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void discharge2reg(FuncState *fs,expdesc *e,int reg)

{
  uint uVar1;
  expdesc *peVar2;
  int iVar3;
  ravi_type_map rVar4;
  uint bc;
  TString *pTStack_30;
  int ravi_type;
  TString *usertype;
  Instruction *pc;
  expdesc *peStack_18;
  int reg_local;
  expdesc *e_local;
  FuncState *fs_local;
  
  pc._4_4_ = reg;
  peStack_18 = e;
  e_local = (expdesc *)fs;
  luaK_dischargevars(fs,e);
  peVar2 = e_local;
  uVar1 = pc._4_4_;
  switch(peStack_18->k) {
  case VNIL:
    luaK_nil((FuncState *)e_local,pc._4_4_,1);
    break;
  case VTRUE:
  case VFALSE:
    luaK_codeABC((FuncState *)e_local,OP_LOADBOOL,pc._4_4_,(uint)(peStack_18->k == VTRUE),0);
    break;
  case VK:
    luaK_codek((FuncState *)e_local,pc._4_4_,(peStack_18->u).info);
    break;
  case VKFLT:
    iVar3 = luaK_numberK((FuncState *)e_local,(peStack_18->u).nval);
    luaK_codek((FuncState *)peVar2,uVar1,iVar3);
    break;
  case VKINT:
    iVar3 = luaK_intK((FuncState *)e_local,(peStack_18->u).ival);
    luaK_codek((FuncState *)peVar2,uVar1,iVar3);
    break;
  case VNONRELOC:
    if (pc._4_4_ != (peStack_18->u).info) {
      pTStack_30 = (TString *)0x0;
      rVar4 = raviY_get_register_typeinfo((FuncState *)e_local,pc._4_4_,&stack0xffffffffffffffd0);
      if (rVar4 == 8) {
        luaK_codeABC((FuncState *)e_local,OP_RAVI_MOVEI,pc._4_4_,(peStack_18->u).info,0);
      }
      else if (rVar4 == 0x10) {
        luaK_codeABC((FuncState *)e_local,OP_RAVI_MOVEF,pc._4_4_,(peStack_18->u).info,0);
      }
      else if (rVar4 == 0x20) {
        luaK_codeABC((FuncState *)e_local,OP_RAVI_MOVEIARRAY,pc._4_4_,(peStack_18->u).info,0);
      }
      else if (rVar4 == 0x40) {
        luaK_codeABC((FuncState *)e_local,OP_RAVI_MOVEFARRAY,pc._4_4_,(peStack_18->u).info,0);
      }
      else if (rVar4 == 0x80) {
        luaK_codeABC((FuncState *)e_local,OP_RAVI_MOVETAB,pc._4_4_,(peStack_18->u).info,0);
      }
      else {
        luaK_codeABC((FuncState *)e_local,OP_MOVE,pc._4_4_,(peStack_18->u).info,0);
        peVar2 = e_local;
        uVar1 = pc._4_4_;
        if (rVar4 == 0x101) {
          luaK_codeABC((FuncState *)e_local,OP_RAVI_TOSTRING,pc._4_4_,0,0);
        }
        else if (rVar4 == 0x201) {
          luaK_codeABC((FuncState *)e_local,OP_RAVI_TOCLOSURE,pc._4_4_,0,0);
        }
        else if ((rVar4 == 0x401) && (pTStack_30 != (TString *)0x0)) {
          bc = luaK_stringK((FuncState *)e_local,pTStack_30);
          luaK_codeABx((FuncState *)peVar2,OP_RAVI_TOTYPE,uVar1,bc);
        }
      }
    }
    break;
  default:
    if (peStack_18->k == VJMP) {
      return;
    }
    __assert_fail("e->k == VJMP",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                  ,0x2cb,"void discharge2reg(FuncState *, expdesc *, int)");
  case VRELOCABLE:
    usertype = (TString *)(*(long *)(*(long *)e_local + 0x38) + (long)(peStack_18->u).info * 4);
    *(byte *)((long)&usertype->next + 1) = (byte)pc._4_4_ & 0x7f;
    if ((ravi_parser_debug & 1U) != 0) {
      raviY_printf((FuncState *)e_local,"discharge2reg (VRELOCABLE set arg A) %e\n",peStack_18);
    }
    if ((ravi_parser_debug & 2U) != 0) {
      raviY_printf((FuncState *)e_local,"[%d]* %o ; set A to %d\n",(ulong)(uint)(peStack_18->u).info
                   ,(ulong)*(uint *)&usertype->next,(ulong)pc._4_4_);
    }
  }
  (peStack_18->u).info = pc._4_4_;
  peStack_18->k = VNONRELOC;
  return;
}

Assistant:

static void discharge2reg (FuncState *fs, expdesc *e, int reg) {
  luaK_dischargevars(fs, e);
  switch (e->k) {
    case VNIL: {
      luaK_nil(fs, reg, 1);
      break;
    }
    case VFALSE: case VTRUE: {
      luaK_codeABC(fs, OP_LOADBOOL, reg, e->k == VTRUE, 0);
      break;
    }
    case VK: {
      luaK_codek(fs, reg, e->u.info);
      break;
    }
    case VKFLT: {
      luaK_codek(fs, reg, luaK_numberK(fs, e->u.nval));
      break;
    }
    case VKINT: {
      luaK_codek(fs, reg, luaK_intK(fs, e->u.ival));
      break;
    }
    case VRELOCABLE: {
      Instruction *pc = &getinstruction(fs, e);
      SETARG_A(*pc, reg);  /* instruction will put result in 'reg' */
      DEBUG_EXPR(raviY_printf(fs, "discharge2reg (VRELOCABLE set arg A) %e\n", e));
      DEBUG_CODEGEN(raviY_printf(fs, "[%d]* %o ; set A to %d\n", e->u.info, *pc, reg));
      break;
    }
    case VNONRELOC: {
      if (reg != e->u.info) {
        /* code a MOVEI or MOVEF if the target register is a local typed variable */
        TString *usertype = NULL;
        int ravi_type = raviY_get_register_typeinfo(fs, reg, &usertype);
        switch (ravi_type) {
        case RAVI_TM_INTEGER:
          luaK_codeABC(fs, OP_RAVI_MOVEI, reg, e->u.info, 0);
          break;
        case RAVI_TM_FLOAT:
          luaK_codeABC(fs, OP_RAVI_MOVEF, reg, e->u.info, 0);
          break;
        case RAVI_TM_INTEGER_ARRAY:
          luaK_codeABC(fs, OP_RAVI_MOVEIARRAY, reg, e->u.info, 0);
          break;
        case RAVI_TM_FLOAT_ARRAY:
          luaK_codeABC(fs, OP_RAVI_MOVEFARRAY, reg, e->u.info, 0);
          break;
        case RAVI_TM_TABLE:
          luaK_codeABC(fs, OP_RAVI_MOVETAB, reg, e->u.info, 0);
          break;
        default:
          luaK_codeABC(fs, OP_MOVE, reg, e->u.info, 0);
          if (ravi_type == RAVI_TM_STRING_OR_NIL)
            luaK_codeABC(fs, OP_RAVI_TOSTRING, reg, 0, 0);
          else if (ravi_type == RAVI_TM_FUNCTION_OR_NIL)
            luaK_codeABC(fs, OP_RAVI_TOCLOSURE, reg, 0, 0);
          else if (ravi_type == RAVI_TM_USERDATA_OR_NIL && usertype)
            luaK_codeABx(fs, OP_RAVI_TOTYPE, reg, luaK_stringK(fs, usertype));
          break;
        }
      }
      break;
    }
    default: {
      lua_assert(e->k == VJMP);
      return;  /* nothing to do... */
    }
  }
  e->u.info = reg;
  e->k = VNONRELOC;
}